

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool anon_unknown.dwarf_2ca0b::ScrollWhenDraggingOnVoid(ImVec2 *delta,ImGuiMouseButton mouse_button)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  uint uVar3;
  long lVar4;
  bool held;
  bool hovered;
  bool local_2a;
  bool local_29;
  ImRect local_28;
  
  lVar4 = ImGui::GetCurrentContext();
  pIVar2 = *(ImGuiWindow **)(lVar4 + 0x1a88);
  local_29 = false;
  local_2a = false;
  if (*(int *)(lVar4 + 0x1ac4) == 0) {
    local_28.Min.x = *(float *)(pIVar2 + 0x10);
    local_28.Min.y = *(float *)(pIVar2 + 0x14);
    local_28.Max.x = (float)*(undefined8 *)(pIVar2 + 0x18) + local_28.Min.x;
    local_28.Max.y = (float)((ulong)*(undefined8 *)(pIVar2 + 0x18) >> 0x20) + local_28.Min.y;
    uVar3 = ImGuiWindow::GetID((char *)pIVar2,"##scrolldraggingoverlay");
    ImGui::ButtonBehavior(&local_28,uVar3,&local_29,&local_2a,1);
  }
  if (local_2a == true) {
    fVar1 = delta->x;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      ImGui::SetScrollX(pIVar2,fVar1 + *(float *)(pIVar2 + 0x54));
    }
  }
  if (local_2a == true) {
    fVar1 = delta->y;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      ImGui::SetScrollY(pIVar2,fVar1 + *(float *)(pIVar2 + 0x58));
      return true;
    }
  }
  return false;
}

Assistant:

bool ScrollWhenDraggingOnVoid(const ImVec2& delta, ImGuiMouseButton mouse_button) {
    ImGuiContext& g = *ImGui::GetCurrentContext();
    ImGuiWindow* window = g.CurrentWindow;
    bool hovered = false;
    bool held = false;
    bool dragging = false;
    ImGuiButtonFlags button_flags = (mouse_button == 0) ? ImGuiButtonFlags_MouseButtonLeft : (mouse_button == 1) ? ImGuiButtonFlags_MouseButtonRight : ImGuiButtonFlags_MouseButtonMiddle;
    if (g.HoveredId == 0) // If nothing hovered so far in the frame (not same as IsAnyItemHovered()!)
        ImGui::ButtonBehavior(window->Rect(), window->GetID("##scrolldraggingoverlay"), &hovered, &held, button_flags);
    if (held && delta.x != 0.0f) {
        ImGui::SetScrollX(window, window->Scroll.x + delta.x);
    }
    if (held && delta.y != 0.0f) {
        ImGui::SetScrollY(window, window->Scroll.y + delta.y);
        dragging = true;
    }
    return dragging;
}